

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

LY_ERR ly_dup_prefix_data(ly_ctx *ctx,LY_VALUE_FORMAT format,void *prefix_data,void **prefix_data_p)

{
  LY_ERR LVar1;
  int iVar2;
  undefined8 *object;
  char *pcVar3;
  long *plVar4;
  ulong uVar5;
  size_t sVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  ly_set *ns_list;
  ly_set *local_38;
  
  if (*prefix_data_p != (void *)0x0) {
    __assert_fail("!*prefix_data_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0x581,
                  "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                 );
  }
  LVar1 = LY_SUCCESS;
  switch(format) {
  case LY_VALUE_CANON:
  case LY_VALUE_JSON:
  case LY_VALUE_LYB:
    if (prefix_data != (void *)0x0) {
      __assert_fail("!prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                    ,0x5ad,
                    "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                   );
    }
    *prefix_data_p = (void *)0x0;
    LVar1 = LY_SUCCESS;
    break;
  case LY_VALUE_SCHEMA:
    *prefix_data_p = prefix_data;
    LVar1 = LY_SUCCESS;
    break;
  case LY_VALUE_SCHEMA_RESOLVED:
    if (prefix_data == (void *)0x0) {
      sVar6 = 8;
    }
    else {
      sVar6 = *(long *)((long)prefix_data + -8) << 4 | 8;
    }
    plVar4 = (long *)calloc(1,sVar6);
    if (plVar4 == (long *)0x0) {
      plVar7 = (long *)0x0;
      LVar1 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
      iVar2 = 3;
    }
    else {
      LVar1 = LY_SUCCESS;
      if (prefix_data == (void *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = *(long *)((long)prefix_data + -8) << 4;
      }
      plVar7 = plVar4 + 1;
      memset(plVar4 + *plVar4 * 2 + 1,0,sVar6);
      iVar2 = 0;
    }
    if (iVar2 != 3) {
      if (iVar2 != 0) {
        return LVar1;
      }
      *prefix_data_p = plVar7;
      lVar9 = 8;
      uVar8 = 0;
      do {
        if (prefix_data == (void *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ulong *)((long)prefix_data + -8);
        }
        if (uVar5 <= uVar8) break;
        pcVar3 = *(char **)((long)prefix_data + lVar9 + -8);
        if (pcVar3 != (char *)0x0) {
          pcVar3 = strdup(pcVar3);
          *(char **)((long)plVar7 + lVar9 + -8) = pcVar3;
          if (pcVar3 == (char *)0x0) goto LAB_00129435;
        }
        *(undefined8 *)((long)plVar7 + lVar9) = *(undefined8 *)((long)prefix_data + lVar9);
        plVar7[-1] = plVar7[-1] + 1;
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while( true );
    }
    break;
  case LY_VALUE_XML:
  case LY_VALUE_STR_NS:
    LVar1 = ly_set_new(&local_38);
    if ((LVar1 == LY_SUCCESS) &&
       (*prefix_data_p = local_38, LVar1 = LY_SUCCESS, *(int *)((long)prefix_data + 4) != 0)) {
      uVar8 = 0;
      do {
        object = (undefined8 *)calloc(1,0x18);
        if (object == (undefined8 *)0x0) {
LAB_00129396:
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
          LVar1 = LY_EMEM;
          break;
        }
        LVar1 = ly_set_add(local_38,object,'\x01',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) break;
        lVar9 = *(long *)((long)prefix_data + 8);
        pcVar3 = (char *)**(undefined8 **)(lVar9 + uVar8 * 8);
        if (pcVar3 != (char *)0x0) {
          pcVar3 = strdup(pcVar3);
          *object = pcVar3;
          if (pcVar3 == (char *)0x0) goto LAB_00129396;
        }
        pcVar3 = strdup(*(char **)(*(long *)(lVar9 + uVar8 * 8) + 8));
        object[1] = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_00129396;
        uVar8 = uVar8 + 1;
        LVar1 = LY_SUCCESS;
      } while (uVar8 < *(uint *)((long)prefix_data + 4));
    }
  }
switchD_00129247_default:
  if (LVar1 != LY_SUCCESS) {
    ly_free_prefix_data(format,*prefix_data_p);
    *prefix_data_p = (void *)0x0;
  }
  return LVar1;
LAB_00129435:
  LVar1 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
  goto switchD_00129247_default;
}

Assistant:

LY_ERR
ly_dup_prefix_data(const struct ly_ctx *ctx, LY_VALUE_FORMAT format, const void *prefix_data,
        void **prefix_data_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ns *ns;
    struct lysc_prefix *prefixes = NULL, *orig_pref;
    struct ly_set *ns_list, *orig_ns;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;

    assert(!*prefix_data_p);

    switch (format) {
    case LY_VALUE_SCHEMA:
        *prefix_data_p = (void *)prefix_data;
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        /* copy all the value prefixes */
        orig_pref = (struct lysc_prefix *)prefix_data;
        LY_ARRAY_CREATE_GOTO(ctx, prefixes, LY_ARRAY_COUNT(orig_pref), ret, cleanup);
        *prefix_data_p = prefixes;

        LY_ARRAY_FOR(orig_pref, u) {
            if (orig_pref[u].prefix) {
                prefixes[u].prefix = strdup(orig_pref[u].prefix);
                LY_CHECK_ERR_GOTO(!prefixes[u].prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            prefixes[u].mod = orig_pref[u].mod;
            LY_ARRAY_INCREMENT(prefixes);
        }
        break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        /* copy all the namespaces */
        LY_CHECK_GOTO(ret = ly_set_new(&ns_list), cleanup);
        *prefix_data_p = ns_list;

        orig_ns = (struct ly_set *)prefix_data;
        for (i = 0; i < orig_ns->count; ++i) {
            ns = calloc(1, sizeof *ns);
            LY_CHECK_ERR_GOTO(!ns, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            LY_CHECK_GOTO(ret = ly_set_add(ns_list, ns, 1, NULL), cleanup);

            if (((struct lyxml_ns *)orig_ns->objs[i])->prefix) {
                ns->prefix = strdup(((struct lyxml_ns *)orig_ns->objs[i])->prefix);
                LY_CHECK_ERR_GOTO(!ns->prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            ns->uri = strdup(((struct lyxml_ns *)orig_ns->objs[i])->uri);
            LY_CHECK_ERR_GOTO(!ns->uri, LOGMEM(ctx); ret = LY_EMEM, cleanup);
        }
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        assert(!prefix_data);
        *prefix_data_p = NULL;
        break;
    }

cleanup:
    if (ret) {
        ly_free_prefix_data(format, *prefix_data_p);
        *prefix_data_p = NULL;
    }
    return ret;
}